

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinterface_linux.cpp
# Opt level: O0

uint QNetworkInterfaceManager::interfaceIndexFromName(QString *name)

{
  int iVar1;
  qsizetype qVar2;
  char *__src;
  QString *in_RDI;
  long in_FS_OFFSET;
  int socket;
  uint index;
  ifreq req;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  uint local_5c;
  uint local_4c;
  char local_30 [16];
  uint local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_5c = 0;
  qVar2 = QString::size(in_RDI);
  if (qVar2 < 0x10) {
    iVar1 = qt_safe_socket(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    if (-1 < iVar1) {
      memset(local_30,0xaa,0x28);
      local_20 = 0;
      QString::toLatin1((QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      __src = QByteArray::constData((QByteArray *)0x35d75a);
      strcpy(local_30,__src);
      QByteArray::~QByteArray((QByteArray *)0x35d771);
      iVar1 = qt_safe_ioctl<ifreq*>
                        (in_stack_ffffffffffffff94,
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (ifreq *)0x35d784);
      if (-1 < iVar1) {
        local_5c = local_20;
      }
      qt_safe_close(in_stack_ffffffffffffff94);
    }
    local_4c = local_5c;
  }
  else {
    local_4c = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_4c;
  }
  __stack_chk_fail();
}

Assistant:

uint QNetworkInterfaceManager::interfaceIndexFromName(const QString &name)
{
    uint index = 0;
    if (name.size() >= IFNAMSIZ)
        return index;

    int socket = qt_safe_socket(AF_INET, SOCK_DGRAM, 0);
    if (socket >= 0) {
        struct ifreq req;
        req.ifr_ifindex = 0;
        strcpy(req.ifr_name, name.toLatin1().constData());

        if (qt_safe_ioctl(socket, SIOCGIFINDEX, &req) >= 0)
            index = req.ifr_ifindex;
        qt_safe_close(socket);
    }
    return index;
}